

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator * __thiscall
QMultiHash<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>::erase
          (QMultiHash<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*> *this,
          const_iterator it)

{
  Span *this_00;
  MultiNodeChain<QPersistentModelIndexData_*> *pMVar1;
  iterator it_00;
  piter it_01;
  piter it_02;
  piter it_03;
  Bucket bucket_00;
  const_iterator it_04;
  bool bVar2;
  MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*> *pMVar3;
  size_t sVar4;
  long *in_RSI;
  iterator *in_RDI;
  long in_FS_OFFSET;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *in_stack_00000008;
  Bucket *in_stack_00000010;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *in_stack_00000018;
  Chain *next;
  Chain *e;
  Bucket bucket;
  iterator iter;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_01;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_02;
  iterator *piVar5;
  Span *pSVar6;
  long *plVar7;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  Chain **in_stack_ffffffffffffff60;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *local_98;
  size_t local_90;
  Chain **local_88;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *local_80;
  size_t local_78;
  Chain **local_70;
  Bucket local_48 [2];
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *local_20;
  undefined1 *local_18;
  Chain **local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
              *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
  it_04.i.bucket = in_stack_ffffffffffffff58;
  it_04.i.d = in_stack_ffffffffffffff50;
  it_04.e = in_stack_ffffffffffffff60;
  piVar5 = in_RDI;
  plVar7 = in_RSI;
  detach((QMultiHash<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*> *)in_RDI,it_04);
  (piVar5->i).d =
       (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_> *
       )&DAT_aaaaaaaaaaaaaaaa;
  (piVar5->i).bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  piVar5->e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
  (piVar5->i).d = local_20;
  (piVar5->i).bucket = (size_t)local_18;
  piVar5->e = local_10;
  this_00 = (Span *)*piVar5->e;
  pMVar1 = *(MultiNodeChain<QPersistentModelIndexData_*> **)((long)this_00->offsets + 8);
  *piVar5->e = pMVar1;
  this_01 = in_stack_00000018;
  pSVar6 = this_00;
  if (this_00 != (Span *)0x0) {
    QHashPrivate::MultiNodeChain<QPersistentModelIndexData_*>::~MultiNodeChain
              ((MultiNodeChain<QPersistentModelIndexData_*> *)this_00);
    operator_delete(this_00,0x10);
    this_01 = in_stack_00000018;
  }
  if (pMVar1 == (MultiNodeChain<QPersistentModelIndexData_*> *)0x0) {
    this_02 = (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
               *)piVar5->e;
    pMVar3 = QHashPrivate::
             iterator<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
             ::node((iterator<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                     *)this_02);
    if (this_02 ==
        (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
         *)&pMVar3->value) {
      local_48[0].span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
      local_48[0].index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
      it_00.bucket = (size_t)in_stack_00000010;
      it_00.d = in_stack_00000008;
      QHashPrivate::
      Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>::
      Bucket::Bucket((Bucket *)0x7fdf33,it_00);
      bucket_00.index = (size_t)plVar7;
      bucket_00.span = pSVar6;
      QHashPrivate::
      Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>::
      erase(this_01,bucket_00);
      sVar4 = QHashPrivate::
              Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
              ::Bucket::toBucketIndex
                        (local_48,(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                                   *)*in_RSI);
      if ((sVar4 == *(long *)(*in_RSI + 0x10) - 1U) ||
         (bVar2 = QHashPrivate::
                  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                  ::Bucket::isUnused((Bucket *)0x7fdfa7), bVar2)) {
        QHashPrivate::
        iterator<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
        ::operator++((iterator<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                      *)this_01);
        it_01.bucket = (size_t)in_RDI;
        it_01.d = this_02;
        iterator::iterator((iterator *)this_01,it_01,(Chain **)in_stack_00000010);
        (piVar5->i).d = local_80;
        (piVar5->i).bucket = local_78;
        piVar5->e = local_70;
      }
      else {
        QHashPrivate::
        Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>::
        Bucket::toIterator(in_stack_00000010,in_stack_00000008);
        it_02.bucket = (size_t)in_RDI;
        it_02.d = this_02;
        iterator::iterator((iterator *)this_01,it_02,(Chain **)in_stack_00000010);
        (piVar5->i).d = local_98;
        (piVar5->i).bucket = local_90;
        piVar5->e = local_88;
      }
    }
    else {
      QHashPrivate::
      iterator<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
      ::operator++((iterator<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                    *)this_01);
      it_03.bucket = (size_t)in_RDI;
      it_03.d = this_02;
      iterator::iterator((iterator *)this_01,it_03,(Chain **)in_stack_00000010);
      (piVar5->i).d = in_stack_ffffffffffffff50;
      (piVar5->i).bucket = in_stack_ffffffffffffff58;
      piVar5->e = in_stack_ffffffffffffff60;
    }
  }
  in_RSI[1] = in_RSI[1] + -1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

iterator erase(const_iterator it)
    {
        Q_ASSERT(d);
        iterator iter = detach(it);
        iterator i = iter;
        Chain *e = *i.e;
        Chain *next = e->next;
        *i.e = next;
        delete e;
        if (!next) {
            if (i.e == &i.i.node()->value) {
                // last remaining entry, erase
                typename Data::Bucket bucket(i.i);
                d->erase(bucket);
                if (bucket.toBucketIndex(d) == d->numBuckets - 1 || bucket.isUnused())
                    i = iterator(++iter.i);
                else // 'i' currently has a nullptr chain. So, we must recreate it
                    i = iterator(bucket.toIterator(d));
            } else {
                i = iterator(++iter.i);
            }
        }
        --m_size;
        Q_ASSERT(m_size >= 0);
        return i;
    }